

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

char * parse_http_headers(char *s,char *end,int len,http_message *req)

{
  mg_str *v;
  mg_str *v_00;
  char *__nptr;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  
  lVar4 = 0;
  while( true ) {
    if (lVar4 == 0x27) {
      return (char *)req->header_names;
    }
    v = req->header_names + lVar4;
    v_00 = req->header_values + lVar4;
    pcVar2 = mg_skip(s,end,": ",v);
    s = mg_skip(pcVar2,end,"\r\n",v_00);
    pcVar2 = (char *)req->header_values[lVar4].len;
    while( true ) {
      pcVar2 = pcVar2 + -1;
      if (pcVar2 == (char *)0xffffffffffffffff) goto LAB_0010b9fe;
      __nptr = v_00->p;
      if (__nptr[(long)pcVar2] != ' ') break;
      v_00->len = (size_t)pcVar2;
    }
    if (v->len == 0) break;
    iVar1 = mg_ncasecmp(v->p,"Content-Length",0xe);
    if (iVar1 == 0) {
      sVar3 = strtoll(__nptr,(char **)0x0,10);
      (req->body).len = sVar3;
      (req->message).len = sVar3 + (long)len;
    }
    lVar4 = lVar4 + 1;
  }
LAB_0010b9fe:
  v_00->p = (char *)0x0;
  v->p = (char *)0x0;
  v_00->len = 0;
  v->len = 0;
  return pcVar2;
}

Assistant:

static const char *parse_http_headers(const char *s, const char *end, int len,
                                      struct http_message *req) {
    int i;
    for (i = 0; i < (int) ARRAY_SIZE(req->header_names) - 1; i++) {
        struct mg_str *k = &req->header_names[i], *v = &req->header_values[i];

        s = mg_skip(s, end, ": ", k);
        s = mg_skip(s, end, "\r\n", v);

        while (v->len > 0 && v->p[v->len - 1] == ' ') {
            v->len--; /* Trim trailing spaces in header value */
        }

        if (k->len == 0 || v->len == 0) {
            k->p = v->p = NULL;
            k->len = v->len = 0;
            break;
        }

        if (!mg_ncasecmp(k->p, "Content-Length", 14)) {
            req->body.len = to64(v->p);
            req->message.len = len + req->body.len;
        }
    }

    return s;
}